

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O2

void benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Regular>::Connect
               (BenchmarkContext *context,int64_t numSlots)

{
  size_type __n;
  Storage<wigwag::token> *pSVar1;
  pointer psVar2;
  size_type sVar3;
  long size;
  int64_t iVar4;
  bool bVar5;
  StorageArray<wigwag::token> c;
  IOperationProfilerPtr op;
  HandlerType handler;
  vector<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_> s;
  allocator local_101;
  size_type local_100;
  string local_f8;
  StorageArray<wigwag::token> local_d8;
  long local_c8;
  BenchmarkContext *local_c0;
  long local_b8;
  int64_t local_b0;
  size_type local_a8;
  size_type local_a0;
  anon_class_8_1_54a39803 local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  vector<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_> local_68;
  function<void_()> local_50;
  
  __n = context->_iterationsCount;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/wigwag.hpp:25:45)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/wigwag.hpp:25:45)>
             ::_M_manager;
  std::vector<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_>::vector
            (&local_68,__n,(allocator_type *)&local_f8);
  size = __n * numSlots;
  StorageArray<wigwag::token>::StorageArray(&local_d8,size);
  std::__cxx11::string::string((string *)&local_f8,"connect",&local_101);
  local_c8 = size;
  local_c0 = context;
  (*context->_vptr_BenchmarkContext[3])(&local_98,context,&local_f8,size);
  std::__cxx11::string::~string((string *)&local_f8);
  sVar3 = 0;
  local_b0 = 0;
  if (0 < numSlots) {
    local_b0 = numSlots;
  }
  local_a8 = __n;
  if ((long)__n < 1) {
    local_a8 = sVar3;
  }
  local_b8 = numSlots << 3;
  local_100 = 0;
  while( true ) {
    iVar4 = local_b0;
    local_a0 = sVar3;
    if (local_100 == local_a8) break;
    while (psVar2 = local_68.
                    super__Vector_base<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, pSVar1 = local_d8._arr,
          bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      std::function<void_()>::function(&local_50,(function<void_()> *)&local_88);
      wigwag::signal<void()>::connect<std::function<void()>>
                ((signal<void()> *)&local_f8,(function<void_()> *)(psVar2 + local_100),
                 (handler_attributes)&local_50);
      *(pointer *)((long)pSVar1 + sVar3) = local_f8._M_dataplus._M_p;
      local_f8._M_dataplus._M_p = (pointer)0x0;
      wigwag::token::~token((token *)&local_f8);
      std::_Function_base::~_Function_base(&local_50.super__Function_base);
      sVar3 = sVar3 + 8;
    }
    local_100 = local_100 + 1;
    sVar3 = local_a0 + local_b8;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  std::__cxx11::string::string((string *)&local_f8,"disconnect",&local_101);
  local_98.c = &local_d8;
  BenchmarkContext::
  Profile<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Regular>::Connect(benchmarks::BenchmarkContext&,long)::_lambda()_1_>
            (local_c0,&local_f8,local_c8,&local_98);
  std::__cxx11::string::~string((string *)&local_f8);
  StorageArray<wigwag::token>::~StorageArray(&local_d8);
  std::vector<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_>::~vector
            (&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  return;
}

Assistant:

static void Connect(BenchmarkContext& context, int64_t numSlots)
        {
            const auto n = context.GetIterationsCount();

            HandlerType handler = SignalsDesc_::MakeHandler();
            std::vector<SignalType> s(n);
            StorageArray<ConnectionType> c(numSlots * n);

            {
                auto op = context.Profile("connect", numSlots * n);
                for (int64_t j = 0; j < n; ++j)
                    for (int64_t i = 0; i < numSlots; ++i)
                        c[i + j * numSlots].Construct(s[j].connect(handler));
            }

            context.Profile("disconnect", numSlots * n, [&]{ c.Destruct(); });
        }